

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

int PAL_GetResourceString(LPCSTR lpDomain,LPCSTR lpResourceStr,LPWSTR lpWideCharStr,int cchWideChar)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  
  __s = (char *)dgettext();
  sVar2 = strlen(__s);
  iVar1 = UTF8ToUnicode(lpResourceStr,(int)sVar2 + 1,lpWideCharStr,cchWideChar,0);
  return iVar1;
}

Assistant:

int
PALAPI
PAL_GetResourceString(
        IN LPCSTR lpDomain,
        IN LPCSTR lpResourceStr,
        OUT LPWSTR lpWideCharStr,
        IN int cchWideChar
      )
{
#if !defined(__APPLE__) && !defined(__ANDROID__)
    // NOTE: dgettext returns the key if it fails to locate the appropriate
    // resource. In our case, that will be the English string.
    LPCSTR resourceString = dgettext(lpDomain, lpResourceStr);
#else // __APPLE__
    // UNIXTODO: Implement for OSX using the native localization API

    // This is a temporary solution until we add the real native resource support.
    LPCSTR resourceString = lpResourceStr;
#endif // __APPLE__

    int length = strlen(resourceString);
    return UTF8ToUnicode(lpResourceStr, length + 1, lpWideCharStr, cchWideChar, 0);
}